

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O2

void __thiscall
CTcSymPropBase::CTcSymPropBase
          (CTcSymPropBase *this,char *str,size_t len,int copy,tctarg_prop_id_t prop)

{
  CTcSymbol::CTcSymbol(&this->super_CTcSymbol,str,len,copy,TC_SYM_PROP);
  (this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
  _vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_0030aa28;
  this->prop_ = prop;
  this->field_0x2a = this->field_0x2a & 0xf8;
  return;
}

Assistant:

CTcSymPropBase(const char *str, size_t len, int copy,
                   tctarg_prop_id_t prop)
        : CTcSymbol(str, len, copy, TC_SYM_PROP)
    {
        /* remember our property ID */
        prop_ = prop;

        /* we're not referenced yet */
        ref_ = FALSE;

        /* presume it's not a vocabulary property */
        vocab_ = FALSE;

        /* presume it's not a weak property assumption */
        weak_ = FALSE;
    }